

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor.h
# Opt level: O3

void __thiscall
FastPForLib::PFor::encodeArray(PFor *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  size_t sVar2;
  uint32_t *out_00;
  ulong uVar3;
  long lVar4;
  size_t thisnvalue;
  size_t local_50;
  size_t *local_48;
  ulong local_40;
  ulong local_38;
  
  sVar2 = 1;
  *out = (uint32_t)len;
  if (0xffffff < len + 0xffffff) {
    local_38 = len + 0xffffff >> 0x18;
    out_00 = out + 1;
    uVar3 = 0x1000000;
    lVar4 = 0;
    local_48 = nvalue;
    local_40 = len;
    do {
      uVar1 = uVar3;
      if (local_40 < uVar3) {
        uVar1 = local_40;
      }
      local_50 = *local_48 - sVar2;
      __encodeArray(this,in,uVar1 + lVar4,out_00,&local_50);
      uVar3 = uVar3 + 0x1000000;
      lVar4 = lVar4 + -0x1000000;
      in = in + 0x1000000;
      sVar2 = sVar2 + local_50;
      out_00 = out_00 + local_50;
      local_38 = local_38 - 1;
      nvalue = local_48;
    } while (local_38 != 0);
  }
  *nvalue = sVar2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t len, uint32_t *out,
                   size_t &nvalue) {
    *out++ = static_cast<uint32_t>(len);
#ifndef NDEBUG
    const uint32_t *const finalin(in + len);
#endif
    const uint32_t maxsize = (1U << (32 - blocksizeinbits - 1));
    size_t totalnvalue(1);
    // for (size_t i = 0; i < len; i += maxsize)
    for (size_t j = 0; j < (len + maxsize - 1U) / maxsize; ++j) {
      size_t i = j << (32 - blocksizeinbits - 1);
      size_t l = maxsize;
      if (i + maxsize > len) {
        l = len - i;
        assert(l <= maxsize);
      }
      size_t thisnvalue = nvalue - totalnvalue;
      assert(in + i + l <= finalin);
      __encodeArray(&in[i], l, out, thisnvalue);
      totalnvalue += thisnvalue;
      assert(totalnvalue <= nvalue);
      out += thisnvalue;
    }
    nvalue = totalnvalue;
  }